

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpfw.c
# Opt level: O2

void emit_queue(queue_t *q,int up,int64_t now)

{
  anon_struct_2064_3_011ebbaf *paVar1;
  size_t sVar2;
  undefined8 uStack_20;
  
  sVar2 = (q->ring).head;
  if ((sVar2 != (q->ring).tail) && (q->congested_until <= now)) {
    if (up == 0) {
      paVar1 = (q->ring).elements + sVar2;
      sendto(listen_fd,paVar1->data,paVar1->len,0,(sockaddr *)&paVar1->conn->down_addr,
             (paVar1->conn->down_addr).len);
      uStack_20 = 100;
    }
    else {
      paVar1 = (q->ring).elements + sVar2;
      send(paVar1->conn->up_fd,paVar1->data,paVar1->len,0);
      uStack_20 = 0x75;
    }
    fprintf(_stderr,"%ld:%zu:%c:forward\n",now,((q->ring).elements[(q->ring).head].conn)->cid,
            uStack_20);
    (q->ring).head = ((q->ring).head + 1) % (q->ring).depth;
    q->congested_until = now + q->interval_usec;
  }
  return;
}

Assistant:

static void emit_queue(struct queue_t *q, int up, int64_t now)
{
    if (q->ring.head == q->ring.tail)
        return;
    if (now < q->congested_until)
        return;
    if (up) {
        send(q->ring.elements[q->ring.head].conn->up_fd, q->ring.elements[q->ring.head].data, q->ring.elements[q->ring.head].len,
             0);
    } else {
        sendto(listen_fd, q->ring.elements[q->ring.head].data, q->ring.elements[q->ring.head].len, 0,
               (void *)&q->ring.elements[q->ring.head].conn->down_addr.ss, q->ring.elements[q->ring.head].conn->down_addr.len);
    }
    fprintf(stderr, "%" PRId64 ":%zu:%c:forward\n", now, q->ring.elements[q->ring.head].conn->cid, up ? 'u' : 'd');
    q->ring.head = (q->ring.head + 1) % q->ring.depth;
    q->congested_until = now + q->interval_usec;
}